

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayOrListLengthBinaryBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  reference pvVar4;
  LogicalType *pLVar5;
  pointer pAVar6;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  pointer *__ptr;
  LogicalType type;
  vector<long,_true> dimensions;
  _Head_base<0UL,_duckdb::ArrayLengthBinaryFunctionData_*,_false> local_78;
  LogicalType local_70;
  string local_58;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
  if ((char)iVar1 == '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if ((pEVar3->return_type).id_ != UNKNOWN) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      LogicalType::LogicalType(&local_70,&pEVar3->return_type);
      if (local_70.id_ == LIST) {
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,ListLengthBinaryFunction);
        pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,0);
        if (pvVar4 != &local_70) {
          pvVar4->id_ = local_70.id_;
          pvVar4->physical_type_ = local_70.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar4->type_info_,&local_70.type_info_);
        }
        *(undefined8 *)this = 0;
      }
      else {
        if (local_70.id_ != ARRAY) {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"array_length can only be used on arrays or lists","");
          BinderException::BinderException(this_01,&local_58);
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                           (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.
                             arguments,0);
        if (pvVar4 != &local_70) {
          pvVar4->id_ = local_70.id_;
          pvVar4->physical_type_ = local_70.physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&pvVar4->type_info_,&local_70.type_info_);
        }
        ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
        operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                  &bound_function->function,ArrayLengthBinaryFunction);
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        if (local_70.id_ == ARRAY) {
          do {
            local_78._M_head_impl = (ArrayLengthBinaryFunctionData *)ArrayType::GetSize(&local_70);
            if (local_58._M_string_length == local_58.field_2._M_allocated_capacity) {
              ::std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        ((vector<long,_std::allocator<long>_> *)&local_58,
                         (iterator)local_58._M_string_length,(long *)&local_78);
            }
            else {
              *(ArrayLengthBinaryFunctionData **)local_58._M_string_length = local_78._M_head_impl;
              local_58._M_string_length = local_58._M_string_length + 8;
            }
            pLVar5 = ArrayType::GetChildType(&local_70);
            if (&local_70 != pLVar5) {
              local_70.id_ = pLVar5->id_;
              local_70.physical_type_ = pLVar5->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_70.type_info_,&pLVar5->type_info_);
            }
          } while (local_70.id_ == ARRAY);
        }
        local_78._M_head_impl = (ArrayLengthBinaryFunctionData *)operator_new(0x20);
        ((local_78._M_head_impl)->super_FunctionData)._vptr_FunctionData =
             (_func_int **)&PTR__ArrayLengthBinaryFunctionData_02452208;
        ((local_78._M_head_impl)->dimensions).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        ((local_78._M_head_impl)->dimensions).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        ((local_78._M_head_impl)->dimensions).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pAVar6 = unique_ptr<duckdb::ArrayLengthBinaryFunctionData,_std::default_delete<duckdb::ArrayLengthBinaryFunctionData>,_true>
                 ::operator->((unique_ptr<duckdb::ArrayLengthBinaryFunctionData,_std::default_delete<duckdb::ArrayLengthBinaryFunctionData>,_true>
                               *)&local_78);
        ::std::vector<long,_std::allocator<long>_>::operator=
                  (&(pAVar6->dimensions).super_vector<long,_std::allocator<long>_>,
                   (vector<long,_std::allocator<long>_> *)&local_58);
        *(ArrayLengthBinaryFunctionData **)this = local_78._M_head_impl;
        if (local_58._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_58._M_dataplus._M_p);
        }
      }
      LogicalType::~LogicalType(&local_70);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> ArrayOrListLengthBinaryBind(ClientContext &context, ScalarFunction &bound_function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	auto type = arguments[0]->return_type;
	if (type.id() == LogicalTypeId::ARRAY) {
		bound_function.arguments[0] = type;
		bound_function.function = ArrayLengthBinaryFunction;

		// If the input is an array, the dimensions are constant, so we can calculate them at bind time
		vector<int64_t> dimensions;
		while (true) {
			if (type.id() == LogicalTypeId::ARRAY) {
				dimensions.push_back(UnsafeNumericCast<int64_t>(ArrayType::GetSize(type)));
				type = ArrayType::GetChildType(type);
			} else {
				break;
			}
		}
		auto data = make_uniq<ArrayLengthBinaryFunctionData>();
		data->dimensions = dimensions;
		return std::move(data);

	} else if (type.id() == LogicalTypeId::LIST) {
		bound_function.function = ListLengthBinaryFunction;
		bound_function.arguments[0] = type;
		return nullptr;
	} else {
		// Unreachable
		throw BinderException("array_length can only be used on arrays or lists");
	}
}